

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

APInt __thiscall llvm::detail::IEEEFloat::convertQuadrupleAPFloatToAPInt(IEEEFloat *this)

{
  bool bVar1;
  uint uVar2;
  integerPart *piVar3;
  undefined8 extraout_RDX;
  IEEEFloat *in_RSI;
  APInt AVar4;
  ArrayRef<unsigned_long> local_58;
  uint64_t local_48;
  uint64_t words [2];
  ulong local_30;
  uint64_t mysignificand2;
  uint64_t mysignificand;
  uint64_t myexponent;
  IEEEFloat *this_local;
  
  if (in_RSI->semantics != (fltSemantics *)semIEEEquad) {
    __assert_fail("semantics == (const llvm::fltSemantics*)&semIEEEquad",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xb3f,"APInt llvm::detail::IEEEFloat::convertQuadrupleAPFloatToAPInt() const");
  }
  uVar2 = partCount(in_RSI);
  if (uVar2 == 2) {
    bVar1 = isFiniteNonZero(in_RSI);
    if (bVar1) {
      mysignificand = (uint64_t)(in_RSI->exponent + 0x3fff);
      piVar3 = significandParts(in_RSI);
      mysignificand2 = *piVar3;
      piVar3 = significandParts(in_RSI);
      local_30 = piVar3[1];
      if ((mysignificand == 1) && ((local_30 & 0x1000000000000) == 0)) {
        mysignificand = 0;
      }
    }
    else if ((in_RSI->field_0x12 & 7) == 3) {
      mysignificand = 0;
      local_30 = 0;
      mysignificand2 = 0;
    }
    else {
      if ((in_RSI->field_0x12 & 7) == 0) {
        local_30 = 0;
        mysignificand2 = 0;
      }
      else {
        if ((in_RSI->field_0x12 & 7) != 1) {
          __assert_fail("category == fcNaN && \"Unknown category!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0xb51,
                        "APInt llvm::detail::IEEEFloat::convertQuadrupleAPFloatToAPInt() const");
        }
        piVar3 = significandParts(in_RSI);
        mysignificand2 = *piVar3;
        piVar3 = significandParts(in_RSI);
        local_30 = piVar3[1];
      }
      mysignificand = 0x7fff;
    }
    local_48 = mysignificand2;
    words[0] = (long)(int)(uint)((byte)in_RSI->field_0x12 >> 3 & 1) << 0x3f |
               (mysignificand & 0x7fff) << 0x30 | local_30 & 0xffffffffffff;
    ArrayRef<unsigned_long>::ArrayRef<2ul>(&local_58,(unsigned_long (*) [2])&local_48);
    APInt::APInt((APInt *)this,0x80,local_58);
    AVar4._8_8_ = extraout_RDX;
    AVar4.U.pVal = (uint64_t *)this;
    return AVar4;
  }
  __assert_fail("partCount()==2",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xb40,"APInt llvm::detail::IEEEFloat::convertQuadrupleAPFloatToAPInt() const");
}

Assistant:

APInt IEEEFloat::convertQuadrupleAPFloatToAPInt() const {
  assert(semantics == (const llvm::fltSemantics*)&semIEEEquad);
  assert(partCount()==2);

  uint64_t myexponent, mysignificand, mysignificand2;

  if (isFiniteNonZero()) {
    myexponent = exponent+16383; //bias
    mysignificand = significandParts()[0];
    mysignificand2 = significandParts()[1];
    if (myexponent==1 && !(mysignificand2 & 0x1000000000000LL))
      myexponent = 0;   // denormal
  } else if (category==fcZero) {
    myexponent = 0;
    mysignificand = mysignificand2 = 0;
  } else if (category==fcInfinity) {
    myexponent = 0x7fff;
    mysignificand = mysignificand2 = 0;
  } else {
    assert(category == fcNaN && "Unknown category!");
    myexponent = 0x7fff;
    mysignificand = significandParts()[0];
    mysignificand2 = significandParts()[1];
  }

  uint64_t words[2];
  words[0] = mysignificand;
  words[1] = ((uint64_t)(sign & 1) << 63) |
             ((myexponent & 0x7fff) << 48) |
             (mysignificand2 & 0xffffffffffffLL);

  return APInt(128, words);
}